

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::gather_meshops_arg(int *argc,char **argv)

{
  bool bVar1;
  string *psVar2;
  string in_msh;
  string out_geo;
  string arg_check;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (*argc < 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Error: Incorrect argument count.",(allocator<char> *)&local_d0);
    print_ln(&local_b0);
    psVar2 = &local_b0;
    goto LAB_00109ce5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,argv[2],(allocator<char> *)&local_110);
  bVar1 = std::operator==(&local_d0,"-s");
  if (bVar1) {
    if (*argc < 5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Error: Incorrect argument count.",
                 (allocator<char> *)&local_110);
      print_ln(&local_70);
      psVar2 = &local_70;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[3],local_f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,argv[4],&local_111);
      std::__cxx11::string::string((string *)&local_30,(string *)&local_110);
      std::__cxx11::string::string((string *)&local_50,(string *)local_f0);
      execute_silver_linings(&local_30,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)local_f0);
LAB_00109c76:
      psVar2 = &local_110;
    }
  }
  else {
    bVar1 = std::operator==(&local_d0,"-v");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[3],local_f0);
      execute_volume_calculator(&local_110);
      goto LAB_00109c76;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Error: Unrecognized meshops argument.",
               (allocator<char> *)&local_110);
    print_ln(&local_90);
    psVar2 = &local_90;
  }
  std::__cxx11::string::~string((string *)psVar2);
  psVar2 = &local_d0;
LAB_00109ce5:
  std::__cxx11::string::~string((string *)psVar2);
  return;
}

Assistant:

void UI::gather_meshops_arg(int &argc, char *argv[])
{
    if (argc > 3)
    {
        std::string arg_check = argv[2];
        if (arg_check=="-s")
        {
            if (argc>4)
            {
                std::string in_msh = argv[3], out_geo = argv[4];
                execute_silver_linings(in_msh,  out_geo);
            }
            else
            {
                print_ln("Error: Incorrect argument count.");
            }
        }
        else if(arg_check=="-v")
        {
            std::string in_msh = argv[3];
            execute_volume_calculator(in_msh);
        }
        else
        {
            print_ln("Error: Unrecognized meshops argument.");
        }
    }
    else
    {
        print_ln("Error: Incorrect argument count.");
    }
}